

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_vector.hxx
# Opt level: O1

void __thiscall
vigra::ArrayVector<unsigned_char,_std::allocator<unsigned_char>_>::ArrayVector
          (ArrayVector<unsigned_char,_std::allocator<unsigned_char>_> *this,this_type *rhs)

{
  ulong __n;
  pointer __src;
  pointer __dest;
  
  (this->super_ArrayVectorView<unsigned_char>).size_ = 0;
  (this->super_ArrayVectorView<unsigned_char>).data_ = (pointer)0x0;
  __n = (rhs->super_ArrayVectorView<unsigned_char>).size_;
  __src = (rhs->super_ArrayVectorView<unsigned_char>).data_;
  (this->super_ArrayVectorView<unsigned_char>).size_ = __n;
  this->capacity_ = __n;
  if (__n == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)__n < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(__n);
  }
  (this->super_ArrayVectorView<unsigned_char>).data_ = __dest;
  if ((__n != 0) && ((this->super_ArrayVectorView<unsigned_char>).size_ != 0)) {
    memcpy(__dest,__src,__n);
    return;
  }
  return;
}

Assistant:

ArrayVector( this_type const & rhs )
    : view_type(),
      alloc_(rhs.alloc_)
    {
        initImpl(rhs.begin(), rhs.end(), VigraFalseType());
    }